

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

void AddGeneratedSource(cmMakefile *makefile,string *filename,GeneratorType genType)

{
  cmSourceFile *pcVar1;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  cmSourceFile *local_28;
  cmSourceFile *gFile;
  string *psStack_18;
  GeneratorType genType_local;
  string *filename_local;
  cmMakefile *makefile_local;
  
  gFile._4_4_ = genType;
  psStack_18 = filename;
  filename_local = (string *)makefile;
  pcVar1 = cmMakefile::GetOrCreateSource(makefile,filename,true);
  local_28 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"GENERATED",&local_49);
  cmSourceFile::SetProperty(pcVar1,&local_48,"1");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"SKIP_AUTOGEN",&local_81);
  cmSourceFile::SetProperty(pcVar1,&local_80,"On");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  AddToSourceGroup((cmMakefile *)filename_local,psStack_18,gFile._4_4_);
  return;
}

Assistant:

static void AddGeneratedSource(cmMakefile* makefile,
                               const std::string& filename,
                               cmQtAutoGeneratorCommon::GeneratorType genType)
{
  cmSourceFile* gFile = makefile->GetOrCreateSource(filename, true);
  gFile->SetProperty("GENERATED", "1");
  gFile->SetProperty("SKIP_AUTOGEN", "On");

  AddToSourceGroup(makefile, filename, genType);
}